

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void cmGlobalNinjaGenerator::WriteVariable
               (ostream *os,string *name,string *value,string *comment,int indent)

{
  ulong uVar1;
  ostream *poVar2;
  undefined1 local_80 [8];
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  string *psStack_28;
  int indent_local;
  string *comment_local;
  string *value_local;
  string *name_local;
  ostream *os_local;
  
  local_2c = indent;
  psStack_28 = comment;
  comment_local = value;
  value_local = name;
  name_local = (string *)os;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmSystemTools::TrimWhitespace((string *)local_80,comment_local);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      WriteComment((ostream *)name_local,psStack_28);
      Indent((ostream *)name_local,local_2c);
      poVar2 = std::operator<<((ostream *)name_local,(string *)value_local);
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = std::operator<<(poVar2,(string *)local_80);
      std::operator<<(poVar2,"\n");
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    std::operator+(&local_50,"No name given for WriteVariable! called with comment: ",psStack_28);
    cmSystemTools::Error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteVariable(std::ostream& os,
                                           const std::string& name,
                                           const std::string& value,
                                           const std::string& comment,
                                           int indent)
{
  // Make sure we have a name.
  if (name.empty()) {
    cmSystemTools::Error("No name given for WriteVariable! called "
                         "with comment: " +
                         comment);
    return;
  }

  // Do not add a variable if the value is empty.
  std::string val = cmSystemTools::TrimWhitespace(value);
  if (val.empty()) {
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);
  cmGlobalNinjaGenerator::Indent(os, indent);
  os << name << " = " << val << "\n";
}